

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this)

{
  uint uVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  Fad<Fad<double>_> *pFVar4;
  double *pdVar5;
  int i;
  ulong uVar6;
  double dVar7;
  value_type vVar8;
  FadBinaryPow<Fad<double>,_Fad<double>_> local_38;
  
  pFVar3 = this->left_;
  pFVar4 = this->right_;
  local_38.left_ = &pFVar3->val_;
  local_38.right_ = &pFVar4->val_;
  dVar7 = pow((pFVar3->val_).val_,(pFVar4->val_).val_);
  __return_storage_ptr__->val_ = dVar7;
  uVar1 = (pFVar3->val_).dx_.num_elts;
  uVar2 = (pFVar4->val_).dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar2 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar2;
    pdVar5 = (double *)operator_new__((ulong)uVar2 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar6 = 0;
    do {
      vVar8 = FadBinaryPow<Fad<double>,_Fad<double>_>::dx(&local_38,(int)uVar6);
      pdVar5[uVar6] = vVar8;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return pow( left_.val(), right_.val() );}